

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curve25519.cc
# Opt level: O2

void fe_tobytes(uint8_t *s,fe *f)

{
  uint64_t *puVar1;
  uint uVar2;
  uint _assert_fe_i;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  
  lVar3 = 0;
  do {
    if (lVar3 == 5) {
      uVar4 = f->v[0] + 0xfff8000000000013;
      uVar9 = (f->v[1] + 0xfff8000000000001) - (ulong)(-(uint)(uVar4 >> 0x33) & 0xff);
      uVar11 = (f->v[2] + 0xfff8000000000001) - (ulong)(-(uint)(uVar9 >> 0x33) & 0xff);
      uVar6 = (f->v[3] + 0xfff8000000000001) - (ulong)(-(uint)(uVar11 >> 0x33) & 0xff);
      uVar10 = (f->v[4] + 0xfff8000000000001) - (ulong)(-(uint)(uVar6 >> 0x33) & 0xff);
      uVar5 = -(ulong)((uVar10 & 0x7f8000000000000) != 0);
      uVar7 = (uVar5 & 0x7ffffffffffed) + (uVar4 & 0x7ffffffffffff);
      uVar4 = uVar5 & 0x7ffffffffffff;
      uVar9 = (uVar9 & 0x7ffffffffffff) + uVar4 + (uVar7 >> 0x33);
      uVar11 = (uVar11 & 0x7ffffffffffff) + uVar4 + (uVar9 >> 0x33);
      uVar4 = uVar4 + (uVar6 & 0x7ffffffffffff) + (uVar11 >> 0x33);
      uVar5 = uVar5 + uVar10 + (uVar4 >> 0x33);
      uVar8 = (uint)uVar11;
      uVar2 = (uint)uVar9;
      *s = (uint8_t)uVar7;
      s[1] = (uint8_t)(uVar7 >> 8);
      s[2] = (uint8_t)(uVar7 >> 0x10);
      s[3] = (uint8_t)(uVar7 >> 0x18);
      s[4] = (uint8_t)(uVar7 >> 0x20);
      s[5] = (uint8_t)(uVar7 >> 0x28);
      s[6] = ((byte)(uVar7 >> 0x30) & 7) + (char)uVar9 * '\b';
      s[7] = (uint8_t)(uVar2 >> 5);
      s[8] = (uint8_t)(uVar2 >> 0xd);
      s[9] = (uint8_t)(uVar2 >> 0x15);
      s[10] = (uint8_t)(uVar9 >> 0x1d);
      s[0xb] = (uint8_t)(uVar9 >> 0x25);
      s[0xc] = (byte)(uint)(uVar9 >> 0x2d) & 0x3f | (byte)(uVar8 << 6);
      s[0xd] = (uint8_t)(uVar8 >> 2);
      s[0xe] = (uint8_t)(uVar8 >> 10);
      s[0xf] = (uint8_t)(uVar11 >> 0x12);
      s[0x10] = (uint8_t)(uVar11 >> 0x1a);
      s[0x11] = (uint8_t)(uVar11 >> 0x22);
      s[0x12] = (uint8_t)(uVar11 >> 0x2a);
      s[0x13] = ((byte)(uint)(uVar11 >> 0x32) & 1) + (char)uVar4 * '\x02';
      s[0x14] = (uint8_t)(uVar4 >> 7);
      s[0x15] = (uint8_t)(uVar4 >> 0xf);
      s[0x16] = (uint8_t)(uVar4 >> 0x17);
      s[0x17] = (uint8_t)(uVar4 >> 0x1f);
      s[0x18] = (uint8_t)(uVar4 >> 0x27);
      s[0x19] = (byte)(uint)(uVar4 >> 0x2f) & 0xf | (byte)((int)uVar5 << 4);
      s[0x1a] = (uint8_t)(uVar5 >> 4);
      s[0x1b] = (uint8_t)(uVar5 >> 0xc);
      s[0x1c] = (uint8_t)(uVar5 >> 0x14);
      s[0x1d] = (uint8_t)(uVar5 >> 0x1c);
      s[0x1e] = (uint8_t)(uVar5 >> 0x24);
      s[0x1f] = (byte)(uVar5 >> 0x2c) & 0x7f;
      return;
    }
    puVar1 = f->v + lVar3;
    lVar3 = lVar3 + 1;
  } while (*puVar1 < 0x8cccccccccccd);
  __assert_fail("constant_time_declassify_int(f->v[_assert_fe_i] <= 0x8ccccccccccccUL)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/curve25519/curve25519.cc"
                ,0xa6,"void fe_tobytes(uint8_t *, const fe *)");
}

Assistant:

static void fe_tobytes(uint8_t s[32], const fe *f) {
  assert_fe(f->v);
  fiat_25519_to_bytes(s, f->v);
}